

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O3

bool __thiscall
cmCMakeHostSystemInformationCommand::GetValue
          (cmCMakeHostSystemInformationCommand *this,SystemInformation *info,string *key,
          string *value)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  size_t value_00;
  char *pcVar5;
  string e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  pcVar5 = "NUMBER_OF_LOGICAL_CORES";
  iVar1 = std::__cxx11::string::compare((char *)key);
  if (iVar1 == 0) {
    uVar2 = cmsys::SystemInformation::GetNumberOfLogicalCPU(info);
LAB_0040481c:
    value_00 = (size_t)uVar2;
  }
  else {
    pcVar5 = "NUMBER_OF_PHYSICAL_CORES";
    iVar1 = std::__cxx11::string::compare((char *)key);
    if (iVar1 == 0) {
      uVar2 = cmsys::SystemInformation::GetNumberOfPhysicalCPU(info);
      goto LAB_0040481c;
    }
    iVar1 = std::__cxx11::string::compare((char *)key);
    if (iVar1 == 0) {
      pcVar3 = cmsys::SystemInformation::GetHostname(info);
      pcVar5 = "";
      if (pcVar3 != (char *)0x0) {
        pcVar5 = pcVar3;
      }
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      sVar4 = strlen(pcVar5);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,pcVar5,pcVar5 + sVar4);
      std::__cxx11::string::operator=((string *)value,(string *)&local_60);
      local_40.field_2._M_allocated_capacity = local_60.field_2._M_allocated_capacity;
      local_40._M_dataplus._M_p = local_60._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p == &local_60.field_2) {
        return true;
      }
      goto LAB_00404848;
    }
    iVar1 = std::__cxx11::string::compare((char *)key);
    if (iVar1 == 0) {
      cmsys::SystemInformation::GetFullyQualifiedDomainName_abi_cxx11_(&local_40,info);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,local_40._M_dataplus._M_p,
                 local_40._M_dataplus._M_p + local_40._M_string_length);
      std::__cxx11::string::operator=((string *)value,(string *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p == &local_40.field_2) {
        return true;
      }
      goto LAB_00404848;
    }
    pcVar5 = "TOTAL_VIRTUAL_MEMORY";
    iVar1 = std::__cxx11::string::compare((char *)key);
    if (iVar1 == 0) {
      value_00 = cmsys::SystemInformation::GetTotalVirtualMemory(info);
    }
    else {
      pcVar5 = "AVAILABLE_VIRTUAL_MEMORY";
      iVar1 = std::__cxx11::string::compare((char *)key);
      if (iVar1 == 0) {
        value_00 = cmsys::SystemInformation::GetAvailableVirtualMemory(info);
      }
      else {
        pcVar5 = "TOTAL_PHYSICAL_MEMORY";
        iVar1 = std::__cxx11::string::compare((char *)key);
        if (iVar1 == 0) {
          value_00 = cmsys::SystemInformation::GetTotalPhysicalMemory(info);
        }
        else {
          pcVar5 = "AVAILABLE_PHYSICAL_MEMORY";
          iVar1 = std::__cxx11::string::compare((char *)key);
          if (iVar1 != 0) {
            std::operator+(&local_60,"does not recognize <key> ",key);
            cmCommand::SetError(&this->super_cmCommand,&local_60);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            return false;
          }
          value_00 = cmsys::SystemInformation::GetAvailablePhysicalMemory(info);
        }
      }
    }
  }
  ValueToString_abi_cxx11_(&local_60,(cmCMakeHostSystemInformationCommand *)pcVar5,value_00);
  std::__cxx11::string::operator=((string *)value,(string *)&local_60);
  local_40.field_2._M_allocated_capacity = local_60.field_2._M_allocated_capacity;
  local_40._M_dataplus._M_p = local_60._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p == &local_60.field_2) {
    return true;
  }
LAB_00404848:
  operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  return true;
}

Assistant:

bool cmCMakeHostSystemInformationCommand
::GetValue(cmsys::SystemInformation &info,
           std::string const& key, std::string &value)
{
  if(key == "NUMBER_OF_LOGICAL_CORES")
    {
    value = this->ValueToString(info.GetNumberOfLogicalCPU());
    }
  else if(key == "NUMBER_OF_PHYSICAL_CORES")
    {
    value = this->ValueToString(info.GetNumberOfPhysicalCPU());
    }
  else if(key == "HOSTNAME")
    {
    value = this->ValueToString(info.GetHostname());
    }
  else if(key == "FQDN")
    {
    value = this->ValueToString(info.GetFullyQualifiedDomainName());
    }
  else if(key == "TOTAL_VIRTUAL_MEMORY")
    {
    value = this->ValueToString(info.GetTotalVirtualMemory());
    }
  else if(key == "AVAILABLE_VIRTUAL_MEMORY")
    {
    value = this->ValueToString(info.GetAvailableVirtualMemory());
    }
  else if(key == "TOTAL_PHYSICAL_MEMORY")
    {
    value = this->ValueToString(info.GetTotalPhysicalMemory());
    }
  else if(key == "AVAILABLE_PHYSICAL_MEMORY")
    {
    value = this->ValueToString(info.GetAvailablePhysicalMemory());
    }
  else
    {
    std::string e = "does not recognize <key> " + key;
    this->SetError(e);
    return false;
    }

  return true;
}